

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
Accept<rapidjson::internal::Hasher<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *handler)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  SizeType SVar4;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar5;
  ConstMemberIterator CVar6;
  Ch *pCVar7;
  unsigned_long *puVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Pointer this_01;
  
  uVar1 = *(ushort *)(this + 0xe);
  switch(uVar1 & 7) {
  case 0:
    puVar8 = internal::Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
             Push<unsigned_long>(&handler->stack_,1);
    uVar11 = 0xaf63bd4c8601b7df;
    break;
  case 1:
    puVar8 = internal::Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
             Push<unsigned_long>(&handler->stack_,1);
    uVar11 = 0xaf63bc4c8601b62c;
    break;
  case 2:
    puVar8 = internal::Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
             Push<unsigned_long>(&handler->stack_,1);
    uVar11 = 0xaf63bf4c8601bb45;
    break;
  case 3:
    if (uVar1 != 3) {
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                    ,0x4f4,
                    "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    this_01 = (Pointer)(*(ulong *)(this + 8) & 0xffffffffffff);
    CVar6 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)this);
    bVar3 = CVar6.ptr_ == this_01;
    do {
      if (bVar3) {
LAB_00121a81:
        bVar3 = internal::
                Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::EndObject(handler,*(SizeType *)this);
        return bVar3;
      }
      if ((undefined1  [16])
          ((undefined1  [16])(this_01->name).data_ & (undefined1  [16])0x400000000000000) ==
          (undefined1  [16])0x0) {
        __assert_fail("m->name.IsString()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                      ,0x7a6,
                      "bool rapidjson::GenericValue<rapidjson::UTF8<>>::Accept(Handler &) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, Handler = rapidjson::internal::Hasher<rapidjson::UTF8<>, rapidjson::MemoryPoolAllocator<>>]"
                     );
      }
      pCVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(&this_01->name);
      SVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetStringLength(&this_01->name);
      uVar10 = 0xaf63b84c8601af60;
      if (SVar4 != 0) {
        uVar10 = 0xaf63b84c8601af60;
        uVar9 = 0;
        do {
          uVar10 = ((byte)pCVar7[uVar9] ^ uVar10) * 0x100000001b3;
          uVar9 = uVar9 + 1;
        } while (SVar4 != uVar9);
      }
      puVar8 = internal::Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
               Push<unsigned_long>(&handler->stack_,1);
      *puVar8 = uVar10;
      bVar2 = Accept<rapidjson::internal::Hasher<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)&this_01->value,handler);
      if (!bVar2) {
        if (!bVar3) {
          return false;
        }
        goto LAB_00121a81;
      }
      this_01 = this_01 + 1;
      CVar6 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)this);
      bVar3 = this_01 == CVar6.ptr_;
    } while( true );
  case 4:
    if (uVar1 != 4) {
      __assert_fail("IsArray()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                    ,0x68d,
                    "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               *)(*(ulong *)(this + 8) & 0xffffffffffff);
    pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::End((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)this);
    bVar3 = pGVar5 == this_00;
    if (!bVar3) {
      bVar2 = Accept<rapidjson::internal::Hasher<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (this_00,handler);
      if (bVar2) {
        do {
          this_00 = this_00 + 0x10;
          pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    *)GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::End((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this);
          bVar3 = this_00 == pGVar5;
          if (bVar3) goto LAB_0012197f;
          bVar2 = Accept<rapidjson::internal::Hasher<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (this_00,handler);
        } while (bVar2);
      }
      if (!bVar3) {
        return false;
      }
    }
LAB_0012197f:
    bVar3 = internal::
            Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::EndArray(handler,*(SizeType *)this);
    return bVar3;
  case 5:
    uVar11 = 0xaf63b84c8601af60;
    pCVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)this);
    SVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)this);
    if (SVar4 == 0) {
      uVar11 = 0xaf63b84c8601af60;
    }
    else {
      uVar10 = 0;
      do {
        uVar11 = ((byte)pCVar7[uVar10] ^ uVar11) * 0x100000001b3;
        uVar10 = uVar10 + 1;
      } while (SVar4 != uVar10);
    }
    puVar8 = internal::Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
             Push<unsigned_long>(&handler->stack_,1);
    *puVar8 = uVar11;
    return true;
  case 6:
    if ((uVar1 >> 9 & 1) != 0) {
      bVar3 = internal::
              Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Double(handler,*(double *)this);
      return bVar3;
    }
    if ((uVar1 & 0x20) != 0) {
      bVar3 = internal::
              Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Int(handler,*(int *)this);
      return bVar3;
    }
    if ((uVar1 & 0x40) != 0) {
      bVar3 = internal::
              Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Uint(handler,*(uint *)this);
      return bVar3;
    }
    if (-1 < (char)uVar1) {
      bVar3 = internal::
              Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Uint64(handler,*(uint64_t *)this);
      return bVar3;
    }
    bVar3 = internal::
            Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Int64(handler,*(uint64_t *)this);
    return bVar3;
  case 7:
    __assert_fail("GetType() == kNumberType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                  ,0x7ba,
                  "bool rapidjson::GenericValue<rapidjson::UTF8<>>::Accept(Handler &) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, Handler = rapidjson::internal::Hasher<rapidjson::UTF8<>, rapidjson::MemoryPoolAllocator<>>]"
                 );
  }
  *puVar8 = uVar11;
  return true;
}

Assistant:

bool Accept(Handler& handler) const {
        switch(GetType()) {
        case kNullType:     return handler.Null();
        case kFalseType:    return handler.Bool(false);
        case kTrueType:     return handler.Bool(true);

        case kObjectType:
            if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
                return false;
            for (ConstMemberIterator m = MemberBegin(); m != MemberEnd(); ++m) {
                RAPIDJSON_ASSERT(m->name.IsString()); // User may change the type of name by MemberIterator.
                if (RAPIDJSON_UNLIKELY(!handler.Key(m->name.GetString(), m->name.GetStringLength(), (m->name.data_.f.flags & kCopyFlag) != 0)))
                    return false;
                if (RAPIDJSON_UNLIKELY(!m->value.Accept(handler)))
                    return false;
            }
            return handler.EndObject(data_.o.size);

        case kArrayType:
            if (RAPIDJSON_UNLIKELY(!handler.StartArray()))
                return false;
            for (ConstValueIterator v = Begin(); v != End(); ++v)
                if (RAPIDJSON_UNLIKELY(!v->Accept(handler)))
                    return false;
            return handler.EndArray(data_.a.size);
    
        case kStringType:
            return handler.String(GetString(), GetStringLength(), (data_.f.flags & kCopyFlag) != 0);
    
        default:
            RAPIDJSON_ASSERT(GetType() == kNumberType);
            if (IsDouble())         return handler.Double(data_.n.d);
            else if (IsInt())       return handler.Int(data_.n.i.i);
            else if (IsUint())      return handler.Uint(data_.n.u.u);
            else if (IsInt64())     return handler.Int64(data_.n.i64);
            else                    return handler.Uint64(data_.n.u64);
        }
    }